

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysc_node_free_(lysf_ctx *ctx,lysc_node *node)

{
  uint16_t uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  lysc_ext_instance *plVar9;
  ulong uVar10;
  char *pcVar11;
  lys_module *plVar12;
  ulong uVar13;
  lysc_node *plVar14;
  bool bVar15;
  lysc_node *plVar16;
  uint64_t c__;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  uVar1 = node->nodetype;
  switch(uVar1) {
  case 1:
    lysc_node_container_free(ctx,(lysc_node_container *)node);
    break;
  case 2:
    lVar19 = 0;
    uVar18 = 0;
    while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
      uVar5._0_1_ = plVar12[-1].implemented;
      uVar5._1_1_ = plVar12[-1].to_compile;
      uVar5._2_1_ = plVar12[-1].latest_revision;
      uVar5._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
      if (uVar5 <= uVar18) {
        free(&plVar12[-1].implemented);
        break;
      }
      lysc_when_free(ctx,(lysc_when **)((long)&plVar12->ctx + lVar19));
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 8;
    }
    plVar16 = *(lysc_node **)(node + 1);
    while (plVar16 != (lysc_node *)0x0) {
      plVar14 = plVar16->next;
      lysc_node_free_(ctx,plVar16);
      plVar16 = plVar14;
    }
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_001598d3_caseD_3:
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
           ,0x4b1);
    break;
  case 4:
    lVar19 = 0;
    uVar18 = 0;
    while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
      uVar7._0_1_ = plVar12[-1].implemented;
      uVar7._1_1_ = plVar12[-1].to_compile;
      uVar7._2_1_ = plVar12[-1].latest_revision;
      uVar7._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
      if (uVar7 <= uVar18) {
        free(&plVar12[-1].implemented);
        break;
      }
      lysc_when_free(ctx,(lysc_when **)((long)&plVar12->ctx + lVar19));
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 8;
    }
    lVar19 = 0;
    uVar18 = 0;
    while (lVar3 = *(long *)(node + 1), lVar3 != 0) {
      if (*(ulong *)(lVar3 + -8) <= uVar18) {
        free((void *)(lVar3 + -8));
        break;
      }
      lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar19));
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 0x38;
    }
    if (node[1].parent != (lysc_node *)0x0) {
      lysc_type_free(ctx,(lysc_type *)node[1].parent);
    }
    lydict_remove(ctx->ctx,(char *)node[1].next);
    bVar15 = true;
    if (node[1].prev != (lysc_node *)0x0) {
      (**(code **)((node[1].prev)->module->revision + 0x38))(ctx->ctx);
      lysc_type_free(ctx,(lysc_type *)(node[1].prev)->module);
      plVar16 = node[1].prev;
LAB_00159cd9:
      bVar15 = true;
      free(plVar16);
    }
    goto LAB_00159cde;
  case 8:
    lVar19 = 0;
    uVar18 = 0;
    while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
      uVar6._0_1_ = plVar12[-1].implemented;
      uVar6._1_1_ = plVar12[-1].to_compile;
      uVar6._2_1_ = plVar12[-1].latest_revision;
      uVar6._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
      if (uVar6 <= uVar18) {
        free(&plVar12[-1].implemented);
        break;
      }
      lysc_when_free(ctx,(lysc_when **)((long)&plVar12->ctx + lVar19));
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 8;
    }
    lVar19 = 0;
    uVar18 = 0;
    while (lVar3 = *(long *)(node + 1), lVar3 != 0) {
      if (*(ulong *)(lVar3 + -8) <= uVar18) {
        free((void *)(lVar3 + -8));
        break;
      }
      lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar19));
      uVar18 = uVar18 + 1;
      lVar19 = lVar19 + 0x38;
    }
    if (node[1].parent != (lysc_node *)0x0) {
      lysc_type_free(ctx,(lysc_type *)node[1].parent);
    }
    lydict_remove(ctx->ctx,(char *)node[1].next);
    pvVar17 = (void *)0x0;
    while( true ) {
      plVar16 = node[1].prev;
      bVar15 = true;
      if (plVar16 == (lysc_node *)0x0) break;
      if (plVar16[-1].priv <= pvVar17) {
        plVar16 = (lysc_node *)&plVar16[-1].priv;
        goto LAB_00159cd9;
      }
      (**(code **)(*(long *)(*(long *)(*(long *)(plVar16->hash + (long)pvVar17 * 8 + -4) + 8) + 0x10
                            ) + 0x38))(ctx->ctx);
      lysc_type_free(ctx,*(lysc_type **)
                          (*(long *)((node[1].prev)->hash + (long)pvVar17 * 8 + -4) + 8));
      free(*(void **)((node[1].prev)->hash + (long)pvVar17 * 8 + -4));
      pvVar17 = (void *)((long)pvVar17 + 1);
    }
    goto LAB_00159cde;
  default:
    if (uVar1 == 0x10) {
      plVar16 = *(lysc_node **)(node + 1);
      while (plVar16 != (lysc_node *)0x0) {
        plVar14 = plVar16->next;
        lysc_node_free_(ctx,plVar16);
        plVar16 = plVar14;
      }
      lVar19 = 0;
      pvVar17 = (void *)0x0;
      while (plVar16 = node[1].parent, plVar16 != (lysc_node *)0x0) {
        if (plVar16[-1].priv <= pvVar17) {
          free(&plVar16[-1].priv);
          break;
        }
        lysc_when_free(ctx,(lysc_when **)(plVar16->hash + lVar19 + -4));
        pvVar17 = (void *)((long)pvVar17 + 1);
        lVar19 = lVar19 + 8;
      }
      lVar19 = 0;
      uVar18 = 0;
      while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
        uVar10._0_1_ = plVar12[-1].implemented;
        uVar10._1_1_ = plVar12[-1].to_compile;
        uVar10._2_1_ = plVar12[-1].latest_revision;
        uVar10._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
        if (uVar10 <= uVar18) {
          free(&plVar12[-1].implemented);
          break;
        }
        lysc_must_free(ctx,(lysc_must *)((long)&plVar12->ctx + lVar19));
        uVar18 = uVar18 + 1;
        lVar19 = lVar19 + 0x38;
      }
      uVar18 = 0;
      while (pcVar11 = node[1].name, pcVar11 != (char *)0x0) {
        if (*(ulong *)(pcVar11 + -8) <= uVar18) {
          free(pcVar11 + -8);
          break;
        }
        if (*(long *)(pcVar11 + uVar18 * 8) != 0) {
          free((void *)(*(long *)(pcVar11 + uVar18 * 8) + -8));
        }
        uVar18 = uVar18 + 1;
      }
      plVar16 = node[1].next;
      while (plVar16 != (lysc_node *)0x0) {
        plVar14 = plVar16->next;
        lysc_node_free_(ctx,plVar16);
        plVar16 = plVar14;
      }
      plVar16 = node[1].prev;
      while (plVar16 != (lysc_node *)0x0) {
        plVar14 = plVar16->next;
        lysc_node_free_(ctx,plVar16);
        plVar16 = plVar14;
      }
    }
    else {
      if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
        lVar19 = 0;
        uVar18 = 0;
        while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
          uVar4._0_1_ = plVar12[-1].implemented;
          uVar4._1_1_ = plVar12[-1].to_compile;
          uVar4._2_1_ = plVar12[-1].latest_revision;
          uVar4._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
          if (uVar4 <= uVar18) {
            free(&plVar12[-1].implemented);
            break;
          }
          lysc_when_free(ctx,(lysc_when **)((long)&plVar12->ctx + lVar19));
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 8;
        }
        lVar19 = 0;
        uVar18 = 0;
        while( true ) {
          lVar3 = *(long *)(node + 1);
          bVar15 = true;
          if (lVar3 == 0) break;
          if (*(ulong *)(lVar3 + -8) <= uVar18) {
            plVar16 = (lysc_node *)(lVar3 + -8);
            goto LAB_00159cd9;
          }
          lysc_must_free(ctx,(lysc_must *)(lVar3 + lVar19));
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 0x38;
        }
        goto LAB_00159cde;
      }
      if (uVar1 == 0x80) {
        lVar19 = 0;
        uVar18 = 0;
        while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
          uVar8._0_1_ = plVar12[-1].implemented;
          uVar8._1_1_ = plVar12[-1].to_compile;
          uVar8._2_1_ = plVar12[-1].latest_revision;
          uVar8._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
          if (uVar8 <= uVar18) {
            free(&plVar12[-1].implemented);
            break;
          }
          lysc_when_free(ctx,(lysc_when **)((long)&plVar12->ctx + lVar19));
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 8;
        }
        plVar16 = *(lysc_node **)(node + 1);
        while (plVar16 != (lysc_node *)0x0) {
          plVar14 = plVar16->next;
          lysc_node_free_(ctx,plVar16);
          plVar16 = plVar14;
        }
      }
      else {
        if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
          lVar19 = 0;
          uVar18 = 0;
          while (lVar3 = *(long *)(node + 1), lVar3 != 0) {
            if (*(ulong *)(lVar3 + -8) <= uVar18) {
              free((void *)(lVar3 + -8));
              break;
            }
            lysc_when_free(ctx,(lysc_when **)(lVar3 + lVar19));
            uVar18 = uVar18 + 1;
            lVar19 = lVar19 + 8;
          }
          if (*(short *)&node[1].module != 0) {
            lysc_node_free_(ctx,(lysc_node *)&node[1].module);
          }
          bVar15 = true;
          if (*(short *)&node[2].next != 0) {
            lysc_node_free_(ctx,(lysc_node *)&node[2].next);
          }
          goto LAB_00159cde;
        }
        if ((uVar1 == 0x2000) || (uVar1 == 0x1000)) {
          lVar19 = 0;
          uVar18 = 0;
          while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
            uVar2._0_1_ = plVar12[-1].implemented;
            uVar2._1_1_ = plVar12[-1].to_compile;
            uVar2._2_1_ = plVar12[-1].latest_revision;
            uVar2._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
            if (uVar2 <= uVar18) {
              free(&plVar12[-1].implemented);
              break;
            }
            lysc_must_free(ctx,(lysc_must *)((long)&plVar12->ctx + lVar19));
            uVar18 = uVar18 + 1;
            lVar19 = lVar19 + 0x38;
          }
          plVar16 = *(lysc_node **)(node + 1);
          while (plVar16 != (lysc_node *)0x0) {
            plVar14 = plVar16->next;
            lysc_node_free_(ctx,plVar16);
            plVar16 = plVar14;
          }
          bVar15 = false;
          goto LAB_00159cde;
        }
        if (uVar1 != 0x400) goto switchD_001598d3_caseD_3;
        lVar19 = 0;
        pvVar17 = (void *)0x0;
        while (plVar16 = node[1].parent, plVar16 != (lysc_node *)0x0) {
          if (plVar16[-1].priv <= pvVar17) {
            free(&plVar16[-1].priv);
            break;
          }
          lysc_when_free(ctx,(lysc_when **)(plVar16->hash + lVar19 + -4));
          pvVar17 = (void *)((long)pvVar17 + 1);
          lVar19 = lVar19 + 8;
        }
        lVar19 = 0;
        uVar18 = 0;
        while (plVar12 = node[1].module, plVar12 != (lys_module *)0x0) {
          uVar13._0_1_ = plVar12[-1].implemented;
          uVar13._1_1_ = plVar12[-1].to_compile;
          uVar13._2_1_ = plVar12[-1].latest_revision;
          uVar13._3_5_ = *(undefined5 *)&plVar12[-1].field_0x7b;
          if (uVar13 <= uVar18) {
            free(&plVar12[-1].implemented);
            break;
          }
          lysc_must_free(ctx,(lysc_must *)((long)&plVar12->ctx + lVar19));
          uVar18 = uVar18 + 1;
          lVar19 = lVar19 + 0x38;
        }
        plVar16 = *(lysc_node **)(node + 1);
        while (plVar16 != (lysc_node *)0x0) {
          plVar14 = plVar16->next;
          lysc_node_free_(ctx,plVar16);
          plVar16 = plVar14;
        }
      }
    }
  }
  bVar15 = true;
LAB_00159cde:
  lVar19 = 0;
  pvVar17 = (void *)0x0;
  do {
    plVar9 = node->exts;
    if (plVar9 == (lysc_ext_instance *)0x0) {
LAB_00159d13:
      if (!bVar15) {
        return;
      }
      free(node);
      return;
    }
    if (plVar9[-1].compiled <= pvVar17) {
      free(&plVar9[-1].compiled);
      goto LAB_00159d13;
    }
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar9->def + lVar19));
    pvVar17 = (void *)((long)pvVar17 + 1);
    lVar19 = lVar19 + 0x48;
  } while( true );
}

Assistant:

static void
lysc_node_free_(struct lysf_ctx *ctx, struct lysc_node *node)
{
    ly_bool inout = 0;

    /* common part */
    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);

    /* nodetype-specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lysc_node_container_free(ctx, (struct lysc_node_container *)node);
        break;
    case LYS_LEAF:
        lysc_node_leaf_free(ctx, (struct lysc_node_leaf *)node);
        break;
    case LYS_LEAFLIST:
        lysc_node_leaflist_free(ctx, (struct lysc_node_leaflist *)node);
        break;
    case LYS_LIST:
        lysc_node_list_free(ctx, (struct lysc_node_list *)node);
        break;
    case LYS_CHOICE:
        lysc_node_choice_free(ctx, (struct lysc_node_choice *)node);
        break;
    case LYS_CASE:
        lysc_node_case_free(ctx, (struct lysc_node_case *)node);
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        lysc_node_anydata_free(ctx, (struct lysc_node_anydata *)node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lysc_node_action_free(ctx, (struct lysc_node_action *)node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lysc_node_action_inout_free(ctx, (struct lysc_node_action_inout *)node);
        inout = 1;
        break;
    case LYS_NOTIF:
        lysc_node_notif_free(ctx, (struct lysc_node_notif *)node);
        break;
    default:
        LOGINT(ctx->ctx);
    }

    FREE_ARRAY(ctx, node->exts, lysc_ext_instance_free);

    if (!inout) {
        free(node);
    }
}